

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O3

int IssueCommandRoboteq(ROBOTEQ *pRoboteq,char *commandType,char *command,char *args,int waitms,
                       char *response,BOOL bPlusMinus)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ssize_t sVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  void *pvVar10;
  char tmp [256];
  char recvbuf [2048];
  char sendbuf [2048];
  uint local_114c;
  char *local_1148;
  char *local_1140;
  char local_1138 [254];
  char acStack_103a [2];
  timespec local_1038 [128];
  char local_838 [2056];
  
  local_1148 = response;
  memset(local_838,0,0x800);
  if (*args == '\0') {
    sprintf(local_838,"%.255s%.255s\r",commandType,command);
  }
  else {
    sprintf(local_838,"%.255s%.255s %.255s\r",commandType,command,args);
  }
  sVar4 = strlen(local_838);
  iVar2 = (pRoboteq->RS232Port).DevType;
  uVar3 = (uint)sVar4;
  if (iVar2 - 1U < 4) {
    if (0 < (int)uVar3) {
      iVar2 = (pRoboteq->RS232Port).s;
      uVar6 = 0;
      do {
        sVar5 = send(iVar2,local_838 + uVar6,(long)(int)(uVar3 - (int)uVar6),0);
        if ((int)sVar5 < 1) {
          return 1;
        }
        uVar9 = (int)uVar6 + (int)sVar5;
        uVar6 = (ulong)uVar9;
      } while ((int)uVar9 < (int)uVar3);
    }
  }
  else {
    if (iVar2 != 0) {
      return 1;
    }
    if (uVar3 != 0) {
      iVar2 = *(int *)&(pRoboteq->RS232Port).hDev;
      uVar6 = 0;
      do {
        sVar5 = write(iVar2,local_838 + uVar6,(ulong)(uVar3 - (int)uVar6));
        if ((int)sVar5 < 1) {
          return 1;
        }
        uVar9 = (int)uVar6 + (int)sVar5;
        uVar6 = (ulong)uVar9;
      } while (uVar9 < uVar3);
    }
  }
  if ((pRoboteq->bSaveRawData != 0) && ((FILE *)pRoboteq->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_838,(long)(int)uVar3,1,(FILE *)pRoboteq->pfSaveFile);
    fflush((FILE *)pRoboteq->pfSaveFile);
  }
  local_1038[0].tv_sec = (__time_t)(waitms / 1000);
  local_1038[0].tv_nsec = (long)((waitms % 1000) * 1000000);
  uVar6 = 0;
  nanosleep(local_1038,(timespec *)0x0);
  if (pRoboteq->bEcho == 0) {
LAB_001acfc1:
    uVar3 = 0;
    memset(local_1038,0,0x800);
    while( true ) {
      if (uVar3 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)uVar3;
        if (acStack_103a[uVar6 + 1] == '\r') {
          if ((pRoboteq->bSaveRawData != 0) &&
             (pFVar1 = (FILE *)pRoboteq->pfSaveFile, pFVar1 != (FILE *)0x0)) {
            sVar4 = strlen((char *)local_1038);
            fwrite(local_1038,sVar4,1,pFVar1);
            fflush((FILE *)pRoboteq->pfSaveFile);
          }
          if (bPlusMinus == 0) {
            sprintf(local_1138,"%.254s=",command);
            local_114c = 0;
            pcVar7 = stristrbeginend((char *)local_1038,local_1138,"\r",&local_1140,
                                     (int *)&local_114c);
            if (pcVar7 != (char *)0x0) {
              do {
                pcVar8 = pcVar7;
                uVar3 = local_114c;
                sVar4 = strlen(local_1138);
                local_114c = 0;
                pcVar7 = stristrbeginend(pcVar8 + (1 - sVar4),local_1138,"\r",&local_1140,
                                         (int *)&local_114c);
              } while (pcVar7 != (char *)0x0);
              sprintf(local_1148,"%.*s",(ulong)uVar3,pcVar8);
              return 0;
            }
          }
          else {
            sVar4 = strlen((char *)local_1038);
            if (1 < sVar4) {
              *local_1148 = *(char *)((long)local_1038 + (sVar4 - 2));
              local_1148[1] = '\0';
              return 0;
            }
          }
          puts("Error reading data from a Roboteq. ");
          return 1;
        }
        if (0x7fe < uVar3) {
          return 1;
        }
      }
      pvVar10 = (void *)((long)&local_1038[0].tv_sec + uVar6);
      iVar2 = (pRoboteq->RS232Port).DevType;
      if (iVar2 - 1U < 4) {
        sVar5 = recv((pRoboteq->RS232Port).s,pvVar10,1,0);
        iVar2 = (int)sVar5;
      }
      else {
        if (iVar2 != 0) {
          return 1;
        }
        sVar5 = read(*(int *)&(pRoboteq->RS232Port).hDev,pvVar10,1);
        iVar2 = (int)sVar5;
      }
      if (iVar2 < 1) break;
      uVar3 = iVar2 + uVar3;
    }
    return 1;
  }
  memset(local_1038,0,0x800);
  do {
    uVar3 = (uint)uVar6;
    if (uVar3 == 0) {
      uVar6 = 0;
    }
    else {
      if (acStack_103a[uVar6 + 1] == '\r') {
        if ((pRoboteq->bSaveRawData != 0) &&
           (pFVar1 = (FILE *)pRoboteq->pfSaveFile, pFVar1 != (FILE *)0x0)) {
          sVar4 = strlen((char *)local_1038);
          fwrite(local_1038,sVar4,1,pFVar1);
          fflush((FILE *)pRoboteq->pfSaveFile);
        }
        goto LAB_001acfc1;
      }
      if (0x7fe < uVar3) {
        return 1;
      }
    }
    pvVar10 = (void *)((long)&local_1038[0].tv_sec + uVar6);
    iVar2 = (pRoboteq->RS232Port).DevType;
    if (iVar2 - 1U < 4) {
      sVar5 = recv((pRoboteq->RS232Port).s,pvVar10,1,0);
      iVar2 = (int)sVar5;
    }
    else {
      if (iVar2 != 0) {
        return 1;
      }
      sVar5 = read(*(int *)&(pRoboteq->RS232Port).hDev,pvVar10,1);
      iVar2 = (int)sVar5;
    }
    if (iVar2 < 1) {
      return 1;
    }
    uVar6 = (ulong)(iVar2 + uVar3);
  } while( true );
}

Assistant:

inline int IssueCommandRoboteq(ROBOTEQ* pRoboteq, char* commandType, char* command, char* args, int waitms, char* response, BOOL bPlusMinus)
{
	char sendbuf[MAX_NB_BYTES_ROBOTEQ];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ROBOTEQ];
	int recvbuflen = 0;
	char tmp[256];
	char* resp = NULL;
	int respstrlen = 0;
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	if (strlen(args) <= 0) sprintf(sendbuf, "%.255s%.255s\r", commandType, command);
	else sprintf(sendbuf, "%.255s%.255s %.255s\r", commandType, command, args);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pRoboteq->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pRoboteq->pfSaveFile);
		fflush(pRoboteq->pfSaveFile);
	}

	mSleep(waitms);
	
	if (pRoboteq->bEcho)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = MAX_NB_BYTES_ROBOTEQ-1; // Ensure it will be a null-terminated string.

		if (ReadUntilRS232Port(&pRoboteq->RS232Port, (unsigned char*)recvbuf, '\r', recvbuflen) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
		{
			fwrite(recvbuf, strlen(recvbuf), 1, pRoboteq->pfSaveFile);
			fflush(pRoboteq->pfSaveFile);
		}
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_ROBOTEQ-1; // Ensure it will be a null-terminated string.

	if (ReadUntilRS232Port(&pRoboteq->RS232Port, (unsigned char*)recvbuf, '\r', recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
	{
		fwrite(recvbuf, strlen(recvbuf), 1, pRoboteq->pfSaveFile);
		fflush(pRoboteq->pfSaveFile);
	}

	// Check for "+\r" or "-\r".
	if (bPlusMinus)
	{
		if (strlen(recvbuf) < 2)
		{
			printf("Error reading data from a Roboteq. \n");
			return EXIT_FAILURE;
		}
		sprintf(response, "%c", recvbuf[strlen(recvbuf)-2]);
		return EXIT_SUCCESS;
	}
	
	sprintf(tmp, "%.254s=", command);
	if (!rstristrbeginend(recvbuf, tmp, "\r", &resp, &respstrlen))
	{
		printf("Error reading data from a Roboteq. \n");
		return EXIT_FAILURE;
	}
	sprintf(response, "%.*s", respstrlen, resp);

	return EXIT_SUCCESS;
}